

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O1

int f(sunrealtype t,N_Vector c,N_Vector cdot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  sunrealtype sVar19;
  sunrealtype in_XMM2_Qa;
  
  lVar8 = N_VGetArrayPointer();
  lVar9 = N_VGetArrayPointer(cdot);
  iVar4 = *(int *)((long)user_data + 0x40);
  iVar5 = *(int *)((long)user_data + 0x44);
  dVar1 = *(double *)((long)user_data + 0x310);
  dVar2 = *(double *)((long)user_data + 0x318);
  iVar17 = 0;
  lVar12 = 0;
  do {
    iVar15 = iVar5;
    if (lVar12 == 0x13) {
      iVar15 = -iVar5;
    }
    iVar16 = -iVar5;
    if (lVar12 == 0) {
      iVar16 = iVar5;
    }
    iVar16 = iVar16 + iVar17;
    iVar15 = iVar15 + iVar17;
    lVar14 = 0;
    iVar18 = iVar17;
    do {
      lVar10 = lVar14 * iVar4 + lVar12 * iVar5;
      WebRates((double)(int)lVar14 * dVar1,(double)(int)lVar12 * dVar2,in_XMM2_Qa,
               (sunrealtype *)(lVar8 + lVar10 * 8),
               (sunrealtype *)((long)user_data + lVar10 * 8 + 0x328),(WebData)user_data);
      iVar7 = iVar4;
      if (lVar14 == 0x13) {
        iVar7 = -iVar4;
      }
      iVar11 = -iVar4;
      if (lVar14 == 0) {
        iVar11 = iVar4;
      }
      if (0 < iVar4) {
        lVar10 = 0;
        do {
          iVar6 = (int)lVar10;
          lVar13 = (long)(iVar18 + iVar6);
          dVar3 = *(double *)(lVar8 + lVar13 * 8);
          in_XMM2_Qa = ((*(double *)(lVar8 + (long)(iVar7 + iVar18 + iVar6) * 8) - dVar3) -
                       (dVar3 - *(double *)(lVar8 + (long)(iVar11 + iVar18 + iVar6) * 8))) *
                       *(double *)((long)user_data + lVar10 * 8 + 0x2b0);
          *(double *)(lVar9 + lVar13 * 8) =
               ((*(double *)(lVar8 + (long)(iVar6 + iVar15) * 8) - dVar3) -
               (dVar3 - *(double *)(lVar8 + (long)(iVar16 + iVar6) * 8))) *
               *(double *)((long)user_data + lVar10 * 8 + 0x2e0) + in_XMM2_Qa +
               *(double *)((long)user_data + lVar13 * 8 + 0x328);
          lVar10 = lVar10 + 1;
        } while ((ulong)(iVar4 + 1) - 1 != lVar10);
      }
      lVar14 = lVar14 + 1;
      iVar18 = iVar18 + iVar4;
      iVar16 = iVar16 + iVar4;
      iVar15 = iVar15 + iVar4;
    } while (lVar14 != 0x14);
    lVar12 = lVar12 + 1;
    iVar17 = iVar17 + iVar5;
  } while (lVar12 != 0x14);
  sVar19 = doubleIntgr(c,(int)user_data,(WebData)0x14);
  *(sunrealtype *)(lVar9 + 0x4b00) = sVar19;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector c, N_Vector cdot, void* user_data)
{
  int i, ic, ici, idxl, idxu, idyl, idyu, iyoff, jx, jy, ns, mxns;
  sunrealtype dcxli, dcxui, dcyli, dcyui, x, y, *cox, *coy, *fsave, dx, dy;
  sunrealtype *cdata, *cdotdata;
  WebData wdata;

  wdata    = (WebData)user_data;
  cdata    = N_VGetArrayPointer(c);
  cdotdata = N_VGetArrayPointer(cdot);

  mxns  = wdata->mxns;
  ns    = wdata->ns;
  fsave = wdata->fsave;
  cox   = wdata->cox;
  coy   = wdata->coy;
  mxns  = wdata->mxns;
  dx    = wdata->dx;
  dy    = wdata->dy;

  for (jy = 0; jy < MY; jy++)
  {
    y     = jy * dy;
    iyoff = mxns * jy;
    idyu  = (jy == MY - 1) ? -mxns : mxns;
    idyl  = (jy == 0) ? -mxns : mxns;
    for (jx = 0; jx < MX; jx++)
    {
      x  = jx * dx;
      ic = iyoff + ns * jx;
      /* Get interaction rates at one point (x,y). */
      WebRates(x, y, t, cdata + ic, fsave + ic, wdata);
      idxu = (jx == MX - 1) ? -ns : ns;
      idxl = (jx == 0) ? -ns : ns;
      for (i = 1; i <= ns; i++)
      {
        ici = ic + i - 1;
        /* Do differencing in y. */
        dcyli = cdata[ici] - cdata[ici - idyl];
        dcyui = cdata[ici + idyu] - cdata[ici];
        /* Do differencing in x. */
        dcxli = cdata[ici] - cdata[ici - idxl];
        dcxui = cdata[ici + idxu] - cdata[ici];
        /* Collect terms and load cdot elements. */
        cdotdata[ici] = coy[i - 1] * (dcyui - dcyli) +
                        cox[i - 1] * (dcxui - dcxli) + fsave[ici];
      }
    }
  }

  /* Quadrature equation (species 1) */
  cdotdata[NEQ] = doubleIntgr(c, ISPEC, wdata);

  return (0);
}